

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O1

uint64_t sum_quotients<short,libdivide::divider<short,(libdivide::Branching)1>>
                   (random_numerators<short> *vals,divider<short,_(libdivide::Branching)1> *div)

{
  byte bVar1;
  uint8_t shift;
  uint uVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  int32_t xl;
  
  if ((ulong)vals->_length != 0) {
    bVar1 = (div->div).denom.more;
    uVar2 = bVar1 & 0x1f;
    iVar4 = (int)(div->div).denom.magic;
    uVar5 = (uint)((char)bVar1 >> 7);
    lVar6 = 0;
    uVar7 = 0;
    do {
      sVar3 = *(short *)((long)vals->_pData + lVar6);
      sVar3 = (short)((uint)(iVar4 * sVar3) >> 0x10) + sVar3;
      uVar7 = uVar7 + (((int)(short)((sVar3 >> 0xf & (short)(1 << uVar2) - (ushort)(iVar4 == 0)) +
                                    sVar3) >> uVar2 ^ uVar5) - uVar5);
      lVar6 = lVar6 + 2;
    } while ((ulong)vals->_length * 2 != lVar6);
    return (ulong)(uVar7 & 0xffff);
  }
  return 0;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}